

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::io::anon_unknown_0::CordOutputStreamTest_DonateFullCordBufferAndBackup_Test::
TestBody(CordOutputStreamTest_DonateFullCordBufferAndBackup_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  ulong *puVar3;
  bool bVar4;
  CordRepFlat *pCVar5;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pdVar6;
  undefined8 *puVar7;
  undefined8 extraout_RAX;
  sbyte sVar8;
  ulong uVar9;
  size_t __n;
  pointer *__ptr_1;
  sbyte sVar10;
  int iVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  int iVar12;
  ulong uVar13;
  char *pcVar14;
  pointer message;
  char *in_R9;
  pointer *__ptr;
  Span<char> SVar15;
  string_view fragment;
  CordBuffer buffer;
  Cord cord;
  int size;
  void *data;
  void *next_available_data;
  void *available_data;
  CordOutputStream output;
  undefined1 local_128 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  ulong local_f8 [2];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_e8;
  long local_e0;
  ulong local_d8 [2];
  anon_union_16_2_b9f6da03_for_Rep_1 local_c8;
  undefined1 local_b8 [8];
  undefined1 auStack_b0 [8];
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  int local_94;
  undefined1 local_90 [16];
  char *local_80;
  anon_union_16_2_b9f6da03_for_Rep_1 local_78;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_60;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  CordOutputStream local_50;
  
  pCVar5 = absl::lts_20250127::cord_internal::CordRepFlat::NewImpl<4096ul>(500);
  (pCVar5->super_CordRep).length = 0;
  local_c8.short_rep.raw_size = (char)pCVar5;
  local_c8._1_7_ = (undefined7)((ulong)pCVar5 >> 8);
  if (((ulong)pCVar5 & 1) == 0) {
    SVar15 = absl::lts_20250127::CordBuffer::Rep::long_available((Rep *)&local_c8.long_rep);
  }
  else {
    SVar15 = absl::lts_20250127::CordBuffer::Rep::short_available((Rep *)&local_c8.long_rep);
  }
  __n = SVar15.len_;
  pdVar6 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)SVar15.ptr_;
  memset(pdVar6,0x61,__n);
  if ((local_c8.short_rep.raw_size & 1U) == 0) {
    puVar3 = (ulong *)CONCAT71(local_c8._1_7_,local_c8.short_rep.raw_size);
    bVar2 = *(byte *)((long)puVar3 + 0xc);
    sVar10 = 0xc;
    if (bVar2 < 0xbb) {
      sVar10 = 6;
    }
    iVar12 = -0xb800d;
    if (bVar2 < 0xbb) {
      iVar12 = -0xe8d;
    }
    sVar8 = 3;
    if (0x42 < bVar2) {
      sVar8 = sVar10;
    }
    iVar11 = -0x1d;
    if (0x42 < bVar2) {
      iVar11 = iVar12;
    }
    uVar9 = (ulong)(int)(((uint)bVar2 << sVar8) + iVar11);
    if ((uVar9 < __n) || (uVar9 < *puVar3 + __n)) {
LAB_00b3f591:
      io::_GLOBAL__N_1::CordOutputStreamTest_DonateFullCordBufferAndBackup_Test::TestBody();
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(auStack_b0 + 8));
      if (local_128 != (undefined1  [8])&local_118) {
        operator_delete((void *)local_128,local_118._M_allocated_capacity + 1);
      }
      if (local_e8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(ulong *)local_e8._M_head_impl + 8))();
      }
      if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()(pdVar6,local_100);
      }
      absl::lts_20250127::Cord::~Cord((Cord *)local_b8);
      CordOutputStream::~CordOutputStream(&local_50);
      absl::lts_20250127::CordBuffer::~CordBuffer((CordBuffer *)&local_c8.long_rep);
      _Unwind_Resume(extraout_RAX);
    }
    *puVar3 = *puVar3 + __n;
  }
  else {
    if ((0xf < __n) || (0xf < (long)(local_c8.short_rep.raw_size >> 1) + __n)) goto LAB_00b3f591;
    local_c8.short_rep.raw_size = (char)SVar15.len_ * '\x02' + local_c8.short_rep.raw_size;
  }
  local_60 = pdVar6 + (__n - 100);
  local_78.short_rep.raw_size = local_c8.short_rep.raw_size;
  local_78._1_7_ = local_c8._1_7_;
  local_78._9_4_ = local_c8._9_4_;
  local_78._13_2_ = local_c8._13_2_;
  local_78.short_rep.data[0xe] = local_c8.short_rep.data[0xe];
  local_c8.short_rep.raw_size = 1;
  local_58 = pdVar6;
  CordOutputStream::CordOutputStream(&local_50,(CordBuffer *)&local_78.long_rep,0);
  if ((local_78.short_rep.raw_size & 1U) == 0) {
    absl::lts_20250127::cord_internal::CordRepFlat::Delete
              ((CordRep *)CONCAT71(local_78._1_7_,local_78.short_rep.raw_size));
  }
  CordOutputStream::BackUp(&local_50,100);
  bVar4 = CordOutputStream::Next(&local_50,&local_80,&local_94);
  local_108._M_head_impl._0_1_ = bVar4;
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)&local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_128,(internal *)&local_108,
               (AssertionResult *)"output.Next(&data, &size)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x46b,(char *)local_128);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    if (local_128 != (undefined1  [8])&local_118) {
      operator_delete((void *)local_128,local_118._M_allocated_capacity + 1);
    }
    if (local_e8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(ulong *)local_e8._M_head_impl + 8))();
    }
    if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_100,local_100);
    }
  }
  testing::internal::CmpHelperEQ<void*,void*>
            ((internal *)local_128,"data","next_available_data",&local_80,&local_60);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (pbStack_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar14 = (pbStack_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x46c,pcVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_108._M_head_impl + 8))();
    }
  }
  if (pbStack_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_120,pbStack_120);
  }
  local_108._M_head_impl._0_4_ = 100;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_128,"size","100",&local_94,(int *)&local_108);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (pbStack_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar14 = (pbStack_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x46d,pcVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_108._M_head_impl + 8))();
    }
  }
  if (pbStack_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_120,pbStack_120);
  }
  builtin_strncpy(local_80,
                  "bbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbb"
                  ,100);
  CordOutputStream::Consume((CordOutputStream *)local_b8);
  if (auStack_b0 == (undefined1  [8])0x0 || (local_b8[0] & 1) == 0) {
LAB_00b3f1ad:
    if (auStack_b0 == (undefined1  [8])0x0 || (local_b8[0] & 1) == 0) {
      if ((local_b8[0] & 1) == 0) {
        local_a8._M_len = (size_t)((ulong)(long)(char)local_b8[0] >> 1);
        local_a8._M_str = (char *)(local_b8 + 1);
      }
      else {
        local_a8._M_len = (size_t)((Nonnull<CordRep_*>)auStack_b0)->length;
        local_a8._M_str =
             (char *)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    else {
      local_128 = (undefined1  [8])0x0;
      pbStack_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      absl::lts_20250127::Cord::GetFlatAux
                ((Nonnull<CordRep_*>)auStack_b0,(Nonnull<absl::string_view_*>)local_128);
      local_a8._M_len = (size_t)local_128;
      local_a8._M_str = (char *)pbStack_120;
    }
    local_108._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8;
    std::__cxx11::string::_M_construct((ulong)&local_108,(char)SVar15.len_ + -100);
    local_e8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8;
    std::__cxx11::string::_M_construct((ulong)&local_e8,'d');
    uVar9 = (long)&(local_100->_M_dataplus)._M_p + local_e0;
    uVar13 = 0xf;
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8) {
      uVar13 = local_f8[0];
    }
    if (uVar13 < uVar9) {
      uVar13 = 0xf;
      if (local_e8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8) {
        uVar13 = local_d8[0];
      }
      if (uVar13 < uVar9) goto LAB_00b3f344;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_e8,0,(char *)0x0,(ulong)local_108._M_head_impl);
    }
    else {
LAB_00b3f344:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_e8._M_head_impl);
    }
    local_128 = (undefined1  [8])&local_118;
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(puVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 == paVar1) {
      local_118._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_118._8_8_ = puVar7[3];
    }
    else {
      local_118._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_128 = (undefined1  [8])*puVar7;
    }
    pbStack_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)puVar7[1];
    *puVar7 = paVar1;
    puVar7[1] = 0;
    paVar1->_M_local_buf[0] = '\0';
    testing::internal::
    CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
              ((internal *)local_90,"flat",
               "std::string(available.size() - 100, \'a\') + std::string(100, \'b\')",
               (basic_string_view<char,_std::char_traits<char>_> *)(auStack_b0 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
    if (local_128 != (undefined1  [8])&local_118) {
      operator_delete((void *)local_128,local_118._M_allocated_capacity + 1);
    }
    if (local_e8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8) {
      operator_delete(local_e8._M_head_impl,local_d8[0] + 1);
    }
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8) {
      operator_delete(local_108._M_head_impl,local_f8[0] + 1);
    }
    if (local_90[0] == '\0') {
      testing::Message::Message((Message *)local_128);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar14 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar14 = *(char **)local_90._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
                 ,0x474,pcVar14);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)local_128);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
      if (local_128 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_128 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_90 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_90._8_8_);
    }
    local_108._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._M_str;
    testing::internal::CmpHelperEQ<char_const*,void*>
              ((internal *)local_128,"flat.data()","available_data",(char **)&local_108,&local_58);
    if (local_128[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_108);
      if (pbStack_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = anon_var_dwarf_a22956 + 5;
      }
      else {
        message = (pbStack_120->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
                 ,0x475,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_108);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_108._M_head_impl !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_108._M_head_impl + 8))();
      }
    }
    if (pbStack_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00b3f545;
    pdVar6 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&pbStack_120;
    __ptr_00 = pbStack_120;
  }
  else {
    local_128 = (undefined1  [8])0x0;
    pbStack_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    bVar4 = absl::lts_20250127::Cord::GetFlatAux
                      ((Nonnull<CordRep_*>)auStack_b0,(Nonnull<absl::string_view_*>)local_128);
    if (bVar4) goto LAB_00b3f1ad;
    pdVar6 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_100;
    local_108._M_head_impl = local_108._M_head_impl & 0xffffffffffffff00;
    local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_128,(internal *)&local_108,(AssertionResult *)"cord.TryFlat()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(auStack_b0 + 8),kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x471,(char *)local_128);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(auStack_b0 + 8),(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(auStack_b0 + 8));
    if (local_128 != (undefined1  [8])&local_118) {
      operator_delete((void *)local_128,local_118._M_allocated_capacity + 1);
    }
    if (local_e8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(ulong *)local_e8._M_head_impl + 8))();
    }
    __ptr_00 = local_100;
    if (local_100 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00b3f545;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(pdVar6,__ptr_00);
LAB_00b3f545:
  absl::lts_20250127::Cord::~Cord((Cord *)local_b8);
  if ((local_50.buffer_.rep_.field_0.short_rep.raw_size & 1U) == 0) {
    absl::lts_20250127::cord_internal::CordRepFlat::Delete
              ((CordRep *)
               CONCAT71(local_50.buffer_.rep_.field_0._1_7_,
                        local_50.buffer_.rep_.field_0.short_rep.raw_size));
  }
  absl::lts_20250127::Cord::~Cord(&local_50.cord_);
  if ((local_c8.short_rep.raw_size & 1U) == 0) {
    absl::lts_20250127::cord_internal::CordRepFlat::Delete
              ((CordRep *)CONCAT71(local_c8._1_7_,local_c8.short_rep.raw_size));
  }
  return;
}

Assistant:

bool IoTest::WriteToOutput(ZeroCopyOutputStream* output, const void* data,
                           int size) {
  const uint8_t* in = reinterpret_cast<const uint8_t*>(data);
  int in_size = size;

  void* out;
  int out_size;

  while (true) {
    if (!output->Next(&out, &out_size)) {
      return false;
    }
    EXPECT_GT(out_size, 0);

    if (in_size <= out_size) {
      memcpy(out, in, in_size);
      output->BackUp(out_size - in_size);
      return true;
    }

    memcpy(out, in, out_size);
    in += out_size;
    in_size -= out_size;
  }
}